

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

bool __thiscall amrex::ParmParse::contains(ParmParse *this,char *name)

{
  _Alloc_hider _Var1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  bool bVar5;
  allocator local_81;
  string local_80;
  _List_node_base *local_60;
  char *local_58;
  string local_50;
  
  p_Var3 = (_List_node_base *)this->m_table;
  local_60 = p_Var3;
  local_58 = name;
  do {
    p_Var3 = (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == local_60) goto LAB_00419cf6;
    std::__cxx11::string::string((string *)&local_80,local_58,&local_81);
    prefixedName(&local_50,this,&local_80);
    _Var1._M_p = local_50._M_dataplus._M_p;
    bVar5 = false;
    if ((p_Var3[4]._M_prev == (_List_node_base *)0x0) &&
       (p_Var3[1]._M_prev == (_List_node_base *)local_50._M_string_length)) {
      if ((_List_node_base *)local_50._M_string_length == (_List_node_base *)0x0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp(local_50._M_dataplus._M_p,p_Var3[1]._M_next,local_50._M_string_length);
        bVar5 = iVar2 == 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_p != &local_50.field_2) {
      operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  } while (!bVar5);
  p_Var4 = (this->m_table->
           super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)this->m_table) {
    do {
      std::__cxx11::string::string((string *)&local_80,local_58,&local_81);
      prefixedName(&local_50,this,&local_80);
      _Var1._M_p = local_50._M_dataplus._M_p;
      bVar5 = false;
      if ((p_Var4[4]._M_prev == (_List_node_base *)0x0) &&
         (bVar5 = false, p_Var4[1]._M_prev == (_List_node_base *)local_50._M_string_length)) {
        if ((_List_node_base *)local_50._M_string_length == (_List_node_base *)0x0) {
          bVar5 = true;
        }
        else {
          iVar2 = bcmp(local_50._M_dataplus._M_p,p_Var4[1]._M_next,local_50._M_string_length);
          bVar5 = iVar2 == 0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        *(undefined1 *)&p_Var4[5]._M_next = 1;
      }
      p_Var4 = (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)this->m_table);
  }
LAB_00419cf6:
  return p_Var3 != local_60;
}

Assistant:

bool
ParmParse::contains (const char* name) const
{
    for ( const_list_iterator li = m_table.begin(), End = m_table.end(); li != End; ++li )
    {
       if ( ppfound(prefixedName(name), *li, false))
       {
           //
           // Found an entry; mark all occurrences of name as used.
           //
           for ( const_list_iterator lli = m_table.begin(); lli != m_table.end(); ++lli )
           {
               if ( ppfound(prefixedName(name), *lli, false) )
               {
                   lli->m_queried = true;
               }
           }
           return true;
       }
    }
    return false;
}